

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodetcGPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  undefined4 in_ESI;
  MCInst *in_RDI;
  uint Register;
  uint local_2c;
  
  switch(in_ESI) {
  case 0:
    local_2c = 0x42;
    break;
  case 1:
    local_2c = 0x43;
    break;
  case 2:
    local_2c = 0x44;
    break;
  case 3:
    local_2c = 0x45;
    break;
  default:
    return MCDisassembler_Fail;
  case 9:
    local_2c = 0x4b;
    break;
  case 0xc:
    local_2c = 0x4e;
  }
  MCOperand_CreateReg0(in_RDI,local_2c);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodetcGPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Register = 0;
	switch (RegNo) {
		case 0:
			Register = ARM_R0;
			break;
		case 1:
			Register = ARM_R1;
			break;
		case 2:
			Register = ARM_R2;
			break;
		case 3:
			Register = ARM_R3;
			break;
		case 9:
			Register = ARM_R9;
			break;
		case 12:
			Register = ARM_R12;
			break;
		default:
			return MCDisassembler_Fail;
	}

	MCOperand_CreateReg0(Inst, Register);
	return MCDisassembler_Success;
}